

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_data.cc
# Opt level: O2

string * GetTestData_abi_cxx11_(string *__return_storage_ptr__,char *path)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  ScopedFILE file;
  string full_path;
  char buf [512];
  
  pcVar2 = getenv("BORINGSSL_TEST_DATA_ROOT");
  pcVar4 = ".";
  if (pcVar2 != (char *)0x0) {
    pcVar4 = pcVar2;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&full_path,pcVar4,(allocator<char> *)buf);
  std::__cxx11::string::push_back((char)&full_path);
  std::__cxx11::string::append((char *)&full_path);
  file._M_t.super___uniq_ptr_impl<_IO_FILE,_bssl::FileDeleter>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_bssl::FileDeleter>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = (__uniq_ptr_data<_IO_FILE,_bssl::FileDeleter,_true,_true>)
                 fopen(full_path._M_dataplus._M_p,"rb");
  if ((tuple<_IO_FILE_*,_bssl::FileDeleter>)
      file._M_t.super___uniq_ptr_impl<_IO_FILE,_bssl::FileDeleter>._M_t.
      super__Tuple_impl<0UL,__IO_FILE_*,_bssl::FileDeleter>.super__Head_base<0UL,__IO_FILE_*,_false>
      ._M_head_impl == (_Head_base<0UL,__IO_FILE_*,_false>)0x0) {
    pcVar4 = "Could not open \'%s\'.\n";
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    while( true ) {
      sVar3 = fread(buf,1,0x200,
                    (FILE *)file._M_t.super___uniq_ptr_impl<_IO_FILE,_bssl::FileDeleter>._M_t.
                            super__Tuple_impl<0UL,__IO_FILE_*,_bssl::FileDeleter>.
                            super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
      if (sVar3 == 0) break;
      std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)buf);
    }
    iVar1 = feof((FILE *)file._M_t.super___uniq_ptr_impl<_IO_FILE,_bssl::FileDeleter>._M_t.
                         super__Tuple_impl<0UL,__IO_FILE_*,_bssl::FileDeleter>.
                         super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
    if (iVar1 != 0) {
      std::unique_ptr<_IO_FILE,_bssl::FileDeleter>::~unique_ptr(&file);
      std::__cxx11::string::~string((string *)&full_path);
      return __return_storage_ptr__;
    }
    pcVar4 = "Error reading from \'%s\'.\n";
  }
  fprintf(_stderr,pcVar4,full_path._M_dataplus._M_p);
  abort();
}

Assistant:

std::string GetTestData(const char *path) {
#if defined(BORINGSSL_USE_BAZEL_RUNFILES)
  std::string error;
  std::unique_ptr<Runfiles> runfiles(
      Runfiles::CreateForTest(BAZEL_CURRENT_REPOSITORY, &error));
  if (runfiles == nullptr) {
    fprintf(stderr, "Could not initialize runfiles: %s\n", error.c_str());
    abort();
  }

  std::string full_path = runfiles->Rlocation(std::string("boringssl/") + path);
  if (full_path.empty()) {
    fprintf(stderr, "Could not find runfile '%s'.\n", path);
    abort();
  }
#else
  const char *root = getenv("BORINGSSL_TEST_DATA_ROOT");
  root = root != nullptr ? root : ".";

  std::string full_path = root;
  full_path.push_back('/');
  full_path.append(path);
#endif

  bssl::ScopedFILE file(fopen(full_path.c_str(), "rb"));
  if (file == nullptr) {
    fprintf(stderr, "Could not open '%s'.\n", full_path.c_str());
    abort();
  }

  std::string ret;
  for (;;) {
    char buf[512];
    size_t n = fread(buf, 1, sizeof(buf), file.get());
    if (n == 0) {
      if (feof(file.get())) {
        return ret;
      }
      fprintf(stderr, "Error reading from '%s'.\n", full_path.c_str());
      abort();
    }
    ret.append(buf, n);
  }
}